

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void av1_get_horver_correlation_full_c
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  short *psVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int16_t *piVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  short *psVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  iVar2 = (int)*diff;
  lVar17 = (long)iVar2;
  uVar3 = (ulong)(uint)(iVar2 * iVar2);
  uVar9 = (ulong)(uint)width;
  uVar11 = uVar3;
  lVar15 = lVar17;
  uVar19 = uVar3;
  lVar20 = lVar17;
  if (width < 2) {
    lVar14 = 0;
  }
  else {
    uVar8 = 1;
    lVar14 = 0;
    do {
      iVar2 = (int)diff[uVar8];
      lVar5 = (long)iVar2;
      lVar20 = lVar20 + lVar5;
      lVar15 = lVar15 + lVar5;
      uVar19 = uVar19 + (uint)(iVar2 * iVar2);
      uVar11 = uVar11 + (uint)(iVar2 * iVar2);
      lVar14 = lVar14 + diff[uVar8 - 1] * lVar5;
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  uVar8 = (ulong)(uint)height;
  if (height < 2) {
    lVar5 = 0;
  }
  else {
    lVar6 = uVar8 - 1;
    lVar5 = 0;
    piVar10 = diff;
    do {
      iVar2 = (int)piVar10[stride];
      sVar1 = *piVar10;
      piVar10 = piVar10 + stride;
      lVar12 = (long)iVar2;
      lVar20 = lVar20 + lVar12;
      lVar17 = lVar17 + lVar12;
      uVar19 = uVar19 + (uint)(iVar2 * iVar2);
      uVar3 = uVar3 + (uint)(iVar2 * iVar2);
      lVar5 = lVar5 + sVar1 * lVar12;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  if (1 < height) {
    psVar4 = diff + 1;
    uVar16 = 1;
    do {
      lVar6 = uVar9 - 1;
      psVar18 = psVar4;
      if (1 < width) {
        do {
          iVar2 = (int)psVar18[stride];
          lVar12 = (long)iVar2;
          lVar20 = lVar20 + lVar12;
          uVar19 = uVar19 + (uint)(iVar2 * iVar2);
          lVar14 = lVar14 + psVar18[(long)stride + -1] * lVar12;
          lVar5 = lVar5 + *psVar18 * lVar12;
          psVar18 = psVar18 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      uVar16 = uVar16 + 1;
      psVar4 = psVar4 + stride;
    } while (uVar16 != uVar8);
  }
  if (width < 1) {
    lVar6 = 0;
    lVar12 = 0;
  }
  else {
    uVar16 = 0;
    lVar12 = 0;
    lVar6 = 0;
    do {
      iVar2 = (int)diff[(long)((height + -1) * stride) + uVar16];
      lVar12 = lVar12 + iVar2;
      lVar6 = lVar6 + (ulong)(uint)(iVar2 * iVar2);
      uVar16 = uVar16 + 1;
    } while (uVar9 != uVar16);
  }
  if (height < 1) {
    lVar7 = 0;
    lVar13 = 0;
  }
  else {
    psVar4 = diff + (long)width + -1;
    lVar13 = 0;
    lVar7 = 0;
    do {
      iVar2 = (int)*psVar4;
      lVar13 = lVar13 + iVar2;
      lVar7 = lVar7 + (ulong)(uint)(iVar2 * iVar2);
      psVar4 = psVar4 + stride;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  lVar13 = lVar20 - lVar13;
  fVar23 = (float)((width + -1) * height);
  lVar12 = lVar20 - lVar12;
  fVar25 = (float)((height + -1) * width);
  fVar24 = (float)(long)(uVar19 - lVar7) - (float)(lVar13 * lVar13) / fVar23;
  fVar26 = (float)(long)(uVar19 - lVar6) - (float)(lVar12 * lVar12) / fVar25;
  fVar22 = 1.0;
  if (0.0 < fVar24) {
    lVar17 = lVar20 - lVar17;
    fVar21 = (float)(long)(uVar19 - uVar3) - (float)(lVar17 * lVar17) / fVar23;
    fVar22 = 1.0;
    if (0.0 < fVar21) {
      fVar21 = fVar21 * fVar24;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar21 = ((float)lVar14 - (float)(lVar13 * lVar17) / fVar23) / fVar21;
      *hcorr = fVar21;
      fVar22 = 0.0;
      if (0.0 <= fVar21) {
        fVar22 = fVar21;
      }
    }
  }
  fVar23 = 1.0;
  *hcorr = fVar22;
  if (0.0 < fVar26) {
    lVar20 = lVar20 - lVar15;
    fVar22 = (float)(long)(uVar19 - uVar11) - (float)(lVar20 * lVar20) / fVar25;
    if (0.0 < fVar22) {
      fVar22 = fVar22 * fVar26;
      if (fVar22 < 0.0) {
        fVar22 = sqrtf(fVar22);
      }
      else {
        fVar22 = SQRT(fVar22);
      }
      fVar22 = ((float)lVar5 - (float)(lVar12 * lVar20) / fVar25) / fVar22;
      *vcorr = fVar22;
      fVar23 = 0.0;
      if (0.0 <= fVar22) {
        fVar23 = fVar22;
      }
    }
  }
  *vcorr = fVar23;
  return;
}

Assistant:

void av1_get_horver_correlation_full_c(const int16_t *diff, int stride,
                                       int width, int height, float *hcorr,
                                       float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - left neighbor pixel
  // z - top neighbor pixel
  int64_t x_sum = 0, x2_sum = 0, xy_sum = 0, xz_sum = 0;
  int64_t x_firstrow = 0, x_finalrow = 0, x_firstcol = 0, x_finalcol = 0;
  int64_t x2_firstrow = 0, x2_finalrow = 0, x2_firstcol = 0, x2_finalcol = 0;

  // First, process horizontal correlation on just the first row
  x_sum += diff[0];
  x2_sum += diff[0] * diff[0];
  x_firstrow += diff[0];
  x2_firstrow += diff[0] * diff[0];
  for (int j = 1; j < width; ++j) {
    const int16_t x = diff[j];
    const int16_t y = diff[j - 1];
    x_sum += x;
    x_firstrow += x;
    x2_sum += x * x;
    x2_firstrow += x * x;
    xy_sum += x * y;
  }

  // Process vertical correlation in the first column
  x_firstcol += diff[0];
  x2_firstcol += diff[0] * diff[0];
  for (int i = 1; i < height; ++i) {
    const int16_t x = diff[i * stride];
    const int16_t z = diff[(i - 1) * stride];
    x_sum += x;
    x_firstcol += x;
    x2_sum += x * x;
    x2_firstcol += x * x;
    xz_sum += x * z;
  }

  // Now process horiz and vert correlation through the rest unit
  for (int i = 1; i < height; ++i) {
    for (int j = 1; j < width; ++j) {
      const int16_t x = diff[i * stride + j];
      const int16_t y = diff[i * stride + j - 1];
      const int16_t z = diff[(i - 1) * stride + j];
      x_sum += x;
      x2_sum += x * x;
      xy_sum += x * y;
      xz_sum += x * z;
    }
  }

  for (int j = 0; j < width; ++j) {
    x_finalrow += diff[(height - 1) * stride + j];
    x2_finalrow +=
        diff[(height - 1) * stride + j] * diff[(height - 1) * stride + j];
  }
  for (int i = 0; i < height; ++i) {
    x_finalcol += diff[i * stride + width - 1];
    x2_finalcol += diff[i * stride + width - 1] * diff[i * stride + width - 1];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}